

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

bool PKCS12CreateVector(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,EVP_PKEY *pkey,
                       vector<x509_st_*,_std::allocator<x509_st_*>_> *certs)

{
  UniquePtr<struct_stack_st_X509> this;
  bool bVar1;
  enable_if_t<_internal::StackTraits<stack_st_X509>::kIsConst,_bool> eVar2;
  int iVar3;
  stack_st_X509 *__p;
  reference ppxVar4;
  pointer psVar5;
  PKCS12 *pPVar6;
  uchar *local_88;
  uint8_t *ptr;
  int len;
  UniquePtr<PKCS12> p12;
  UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> local_60;
  X509 *local_58;
  X509 *cert;
  const_iterator __end1;
  const_iterator __begin1;
  vector<x509_st_*,_std::allocator<x509_st_*>_> *__range1;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_30;
  UniquePtr<struct_stack_st_X509> chain;
  vector<x509_st_*,_std::allocator<x509_st_*>_> *certs_local;
  EVP_PKEY *pkey_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)certs;
  __p = sk_X509_new_null();
  std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&local_30,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  this = chain;
  if (bVar1) {
    __end1 = std::vector<x509_st_*,_std::allocator<x509_st_*>_>::begin
                       ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                        chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
    cert = (X509 *)std::vector<x509_st_*,_std::allocator<x509_st_*>_>::end
                             ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                              this._M_t.
                              super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<x509_st_*const_*,_std::vector<x509_st_*,_std::allocator<x509_st_*>_>_>
                                  *)&cert);
      if (!bVar1) break;
      ppxVar4 = __gnu_cxx::
                __normal_iterator<x509_st_*const_*,_std::vector<x509_st_*,_std::allocator<x509_st_*>_>_>
                ::operator*(&__end1);
      local_58 = *ppxVar4;
      psVar5 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(&local_30);
      bssl::UpRef((bssl *)&local_60,local_58);
      eVar2 = bssl::PushToStack<stack_st_X509>(psVar5,&local_60);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_60);
      if (((eVar2 ^ 0xffU) & 1) != 0) {
        out_local._7_1_ = false;
        goto LAB_004ef463;
      }
      __gnu_cxx::
      __normal_iterator<x509_st_*const_*,_std::vector<x509_st_*,_std::allocator<x509_st_*>_>_>::
      operator++(&__end1);
    }
    psVar5 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(&local_30);
    pPVar6 = PKCS12_create("foo",(char *)0x0,(EVP_PKEY *)pkey,(X509 *)0x0,(stack_st_X509 *)psVar5,0,
                           0,0,0,0);
    std::unique_ptr<pkcs12_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<pkcs12_st,bssl::internal::Deleter> *)&stack0xffffffffffffff88,
               (pointer)pPVar6);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffff88);
    if (bVar1) {
      pPVar6 = (PKCS12 *)
               std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&stack0xffffffffffffff88
                         );
      ptr._4_4_ = i2d_PKCS12(pPVar6,(uchar **)0x0);
      if (ptr._4_4_ < 0) {
        out_local._7_1_ = false;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,(long)ptr._4_4_);
        local_88 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(out);
        pPVar6 = (PKCS12 *)
                 std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)
                            &stack0xffffffffffffff88);
        iVar3 = i2d_PKCS12(pPVar6,&local_88);
        out_local._7_1_ = iVar3 == ptr._4_4_;
      }
    }
    else {
      out_local._7_1_ = false;
    }
    std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&stack0xffffffffffffff88);
  }
  else {
    out_local._7_1_ = false;
  }
LAB_004ef463:
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return out_local._7_1_;
}

Assistant:

static bool PKCS12CreateVector(std::vector<uint8_t> *out, EVP_PKEY *pkey,
                               const std::vector<X509 *> &certs) {
  bssl::UniquePtr<STACK_OF(X509)> chain(sk_X509_new_null());
  if (!chain) {
    return false;
  }

  for (X509 *cert : certs) {
    if (!bssl::PushToStack(chain.get(), bssl::UpRef(cert))) {
      return false;
    }
  }

  bssl::UniquePtr<PKCS12> p12(PKCS12_create(kPassword, nullptr /* name */, pkey,
                                            nullptr /* cert */, chain.get(), 0,
                                            0, 0, 0, 0));
  if (!p12) {
    return false;
  }

  int len = i2d_PKCS12(p12.get(), nullptr);
  if (len < 0) {
    return false;
  }
  out->resize(static_cast<size_t>(len));
  uint8_t *ptr = out->data();
  return i2d_PKCS12(p12.get(), &ptr) == len;
}